

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

iterator __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
insert_value<nestl::has_exceptions::exception_ptr_error,int&>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,const_iterator pos,
          int *args)

{
  const_iterator piVar1;
  void *pvVar2;
  const_iterator piVar3;
  iterator piVar4;
  iterator piVar5;
  iterator piVar6;
  
  piVar1 = *(const_iterator *)(this + 8);
  if (pos < piVar1) {
    __assert_fail("pos >= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2bd,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int &>]"
                 );
  }
  piVar6 = *(iterator *)(this + 0x10);
  if (piVar6 < pos) {
    __assert_fail("pos <= m_finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2be,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int &>]"
                 );
  }
  piVar5 = *(iterator *)(this + 0x18);
  piVar3 = piVar1;
  if (piVar5 == piVar6) {
    vector<int,_nestl::allocator<int>_>::grow<nestl::has_exceptions::exception_ptr_error>
              ((vector<int,_nestl::allocator<int>_> *)this,err,
               ((long)piVar6 - (long)piVar1 >> 2) + 1);
    if ((err->m_exception)._M_exception_object != (void *)0x0) {
      return *(iterator *)(this + 0x10);
    }
    piVar6 = *(iterator *)(this + 0x10);
    piVar5 = *(iterator *)(this + 0x18);
    piVar3 = *(const_iterator *)(this + 8);
  }
  if ((ulong)((long)piVar6 - (long)piVar3) < (ulong)((long)piVar5 - (long)piVar3)) {
    piVar4 = (iterator)((long)piVar3 + ((long)pos - (long)piVar1));
    pvVar2 = (err->m_exception)._M_exception_object;
    piVar5 = piVar6;
    do {
      if (piVar5 == piVar4) {
        *piVar4 = *args;
        if ((err->m_exception)._M_exception_object != (void *)0x0) {
          return piVar6;
        }
        *(iterator *)(this + 0x10) = piVar6 + 1;
        return piVar4;
      }
      *piVar5 = piVar5[-1];
      piVar5 = piVar5 + -1;
    } while (pvVar2 == (void *)0x0);
    return piVar6;
  }
  __assert_fail("capacity() > size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                ,0x2cb,
                "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int &>]"
               );
}

Assistant:

typename vector<T, A>::iterator
vector<T, A>::insert_value(OperationError& err, const_iterator pos, Args&& ... args) NESTL_NOEXCEPT_SPEC
{
    assert(pos >= m_start);
    assert(pos <= m_finish);

    /// we should calculate offset before possible reallocation
    size_t offset = pos - m_start;

    if (capacity() == size())
    {
        grow(err, capacity() + 1);
        if (err)
        {
            return end();
        }
    }
    assert(capacity() > size());

    value_type* last = m_finish;
    value_type* first = m_start + offset;
    for (value_type* val = last; val != first; --val)
    {
        value_type* oldLocation = val - 1;
        nestl::class_operations::construct(err, val, *oldLocation);
        if (err)
        {
            return end();
        }
        nestl::detail::destroy(oldLocation, val);
    }


	nestl::class_operations::construct(err, first, std::forward<Args>(args) ...);
    if (err)
    {
        return end();
    }

    ++m_finish;
    return first;
}